

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O1

tcache_t * duckdb_je_tcache_create_explicit(tsd_t *tsd)

{
  long *plVar1;
  undefined8 *puVar2;
  void *pvVar3;
  rtree_leaf_elm_t *prVar4;
  arena_t *paVar5;
  long lVar6;
  uint uVar7;
  tcache_t *tcache;
  rtree_leaf_elm_t *prVar9;
  atomic_p_t aVar10;
  rtree_ctx_cache_elm_t *prVar11;
  rtree_ctx_cache_elm_t *prVar12;
  rtree_ctx_cache_elm_t *prVar13;
  ulong uVar14;
  rtree_leaf_elm_t *prVar15;
  tsd_t *tsd_00;
  rtree_ctx_t *prVar16;
  tcache_t *tcache_00;
  ulong uVar17;
  size_t usize;
  bool bVar18;
  size_t tcache_size;
  size_t alignment;
  rtree_ctx_t rtree_ctx_fallback;
  ulong uVar8;
  
  duckdb_je_cache_bin_info_compute_alloc
            (opt_tcache_ncached_max,duckdb_je_global_do_not_change_tcache_nbins,&tcache_size,
             &alignment);
  uVar7 = (int)tcache_size + 0x79fU & 0xfffffff8;
  uVar8 = (ulong)uVar7;
  if (alignment < 0x1001 && uVar7 < 0x3801) {
    uVar14 = -alignment & (alignment + uVar8) - 1;
    if (uVar14 < 0x1001) {
      usize = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar14 + 7 >> 3]];
    }
    else if (uVar14 < 0x7000000000000001) {
      uVar17 = uVar14 * 2 - 1;
      lVar6 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      uVar17 = ~(-1L << ((char)lVar6 - 3U & 0x3f));
      if ((uint)lVar6 < 7) {
        uVar17 = 0xf;
      }
      usize = ~uVar17 & uVar14 + uVar17;
    }
    else {
      usize = 0;
    }
    if (usize < 0x4000) goto LAB_00208e15;
  }
  if (alignment < 0x7000000000000001) {
    uVar14 = 0x4000;
    if (0x4000 < uVar7) {
      uVar14 = uVar8 * 2 - 1;
      lVar6 = 0x3f;
      if (uVar14 != 0) {
        for (; uVar14 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      uVar14 = ~(-1L << ((char)lVar6 - 3U & 0x3f));
      if ((uint)lVar6 < 7) {
        uVar14 = 0xf;
      }
      uVar14 = ~uVar14 & uVar14 + uVar8;
      if (uVar14 < uVar8) goto LAB_00208ddc;
    }
    usize = 0;
    if (uVar14 <= (duckdb_je_sz_large_pad + (alignment + 0xfff & 0x7ffffffffffff000) + uVar14) -
                  0x1000) {
      usize = uVar14;
    }
  }
  else {
LAB_00208ddc:
    usize = 0;
  }
LAB_00208e15:
  aVar10 = duckdb_je_arenas[0];
  if (duckdb_je_arenas[0].repr == (void *)0x0) {
    aVar10.repr = duckdb_je_arena_init((tsdn_t *)0x0,0,&duckdb_je_arena_config_default);
  }
  prVar12 = (rtree_ctx_cache_elm_t *)&DAT_00000001;
  tcache = (tcache_t *)
           duckdb_je_arena_palloc
                     ((tsdn_t *)tsd,(arena_t *)aVar10.repr,usize,alignment,true,usize < 0x3801,
                      (tcache_t *)0x0);
  if (tcache != (tcache_t *)0x0) {
    if (tsd == (tsd_t *)0x0) {
      prVar16 = &rtree_ctx_fallback;
      duckdb_je_rtree_ctx_data_init(prVar16);
    }
    else {
      prVar16 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    uVar7 = (uint)((ulong)tcache >> 0x1e) & 0xf;
    prVar15 = (rtree_leaf_elm_t *)((ulong)tcache & 0xffffffffc0000000);
    uVar8 = (ulong)(uVar7 << 4);
    puVar2 = (undefined8 *)((long)&prVar16->cache[0].leafkey + uVar8);
    prVar9 = *(rtree_leaf_elm_t **)((long)&prVar16->cache[0].leafkey + uVar8);
    prVar11 = prVar12;
    if (prVar9 == prVar15) {
      prVar9 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)tcache >> 9) & 0x1ffff8) + puVar2[1]);
    }
    else if ((rtree_leaf_elm_t *)prVar16->l2_cache[0].leafkey == prVar15) {
      prVar4 = prVar16->l2_cache[0].leaf;
      prVar16->l2_cache[0].leafkey = (uintptr_t)prVar9;
      prVar16->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
      *puVar2 = prVar15;
      puVar2[1] = prVar4;
      prVar9 = (rtree_leaf_elm_t *)
               ((long)&(prVar4->le_bits).repr + (ulong)((uint)((ulong)tcache >> 9) & 0x1ffff8));
    }
    else {
      prVar11 = prVar16->l2_cache + 1;
      if ((rtree_leaf_elm_t *)prVar16->l2_cache[1].leafkey == prVar15) {
        uVar14 = 0;
        bVar18 = false;
      }
      else {
        uVar8 = 1;
        prVar13 = prVar11;
        prVar11 = prVar12;
        do {
          uVar14 = uVar8;
          bVar18 = 6 < uVar14;
          if (uVar14 == 7) goto LAB_00209166;
          prVar11 = prVar13 + 1;
          prVar12 = prVar13 + 1;
          uVar8 = uVar14 + 1;
          prVar13 = prVar11;
        } while ((rtree_leaf_elm_t *)prVar12->leafkey != prVar15);
        bVar18 = 6 < uVar14;
      }
      prVar12 = prVar16->l2_cache;
      prVar4 = prVar11->leaf;
      prVar11->leafkey = prVar12[uVar14].leafkey;
      prVar11->leaf = prVar16->l2_cache[uVar14].leaf;
      prVar12[uVar14].leafkey = (uintptr_t)prVar9;
      prVar16->l2_cache[uVar14].leaf = (rtree_leaf_elm_t *)puVar2[1];
      *puVar2 = prVar15;
      puVar2[1] = prVar4;
      prVar9 = (rtree_leaf_elm_t *)
               ((long)&(prVar4->le_bits).repr + (ulong)((uint)((ulong)tcache >> 9) & 0x1ffff8));
      prVar11 = prVar12;
LAB_00209166:
      if (bVar18) {
        prVar11 = (rtree_ctx_cache_elm_t *)&DAT_00000001;
        prVar9 = duckdb_je_rtree_leaf_elm_lookup_hard
                           ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar16,
                            (uintptr_t)tcache,true,false);
      }
    }
    pvVar3 = duckdb_je_arenas
             [*(uint *)(((long)(prVar9->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80) & 0xfff
             ].repr;
    if (tsd == (tsd_t *)0x0) {
      prVar16 = &rtree_ctx_fallback;
      duckdb_je_rtree_ctx_data_init(prVar16);
    }
    else {
      prVar16 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    uVar8 = (ulong)(uVar7 << 4);
    puVar2 = (undefined8 *)((long)&prVar16->cache[0].leafkey + uVar8);
    prVar9 = *(rtree_leaf_elm_t **)((long)&prVar16->cache[0].leafkey + uVar8);
    prVar12 = prVar11;
    if (prVar9 == prVar15) {
      prVar9 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)tcache >> 9) & 0x1ffff8) + puVar2[1]);
    }
    else if ((rtree_leaf_elm_t *)prVar16->l2_cache[0].leafkey == prVar15) {
      prVar4 = prVar16->l2_cache[0].leaf;
      prVar16->l2_cache[0].leafkey = (uintptr_t)prVar9;
      prVar16->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
      *puVar2 = prVar15;
      puVar2[1] = prVar4;
      prVar9 = (rtree_leaf_elm_t *)
               ((long)&(prVar4->le_bits).repr + (ulong)((uint)((ulong)tcache >> 9) & 0x1ffff8));
    }
    else {
      prVar12 = prVar16->l2_cache + 1;
      if ((rtree_leaf_elm_t *)prVar16->l2_cache[1].leafkey == prVar15) {
        uVar14 = 0;
        bVar18 = false;
      }
      else {
        uVar8 = 1;
        prVar13 = prVar12;
        prVar12 = prVar11;
        do {
          uVar14 = uVar8;
          bVar18 = 6 < uVar14;
          if (uVar14 == 7) goto LAB_002091e9;
          prVar12 = prVar13 + 1;
          prVar11 = prVar13 + 1;
          uVar8 = uVar14 + 1;
          prVar13 = prVar12;
        } while ((rtree_leaf_elm_t *)prVar11->leafkey != prVar15);
        bVar18 = 6 < uVar14;
      }
      prVar11 = prVar16->l2_cache;
      prVar4 = prVar12->leaf;
      prVar12->leafkey = prVar11[uVar14].leafkey;
      prVar12->leaf = prVar16->l2_cache[uVar14].leaf;
      prVar11[uVar14].leafkey = (uintptr_t)prVar9;
      prVar16->l2_cache[uVar14].leaf = (rtree_leaf_elm_t *)puVar2[1];
      *puVar2 = prVar15;
      puVar2[1] = prVar4;
      prVar9 = (rtree_leaf_elm_t *)
               ((long)&(prVar4->le_bits).repr + (ulong)((uint)((ulong)tcache >> 9) & 0x1ffff8));
      prVar12 = prVar11;
LAB_002091e9:
      if (bVar18) {
        prVar12 = (rtree_ctx_cache_elm_t *)&DAT_00000001;
        prVar9 = duckdb_je_rtree_leaf_elm_lookup_hard
                           ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar16,
                            (uintptr_t)tcache,true,false);
      }
    }
    LOCK();
    plVar1 = (long *)((long)pvVar3 + 0x48);
    *plVar1 = *plVar1 + duckdb_je_sz_index2size_tab[(ulong)(prVar9->le_bits).repr >> 0x30];
    UNLOCK();
    if (tcache != (tcache_t *)0x0) {
      lVar6 = CONCAT44(tcache_size._4_4_,(int)tcache_size);
      tsd_00 = (tsd_t *)((long)tcache[1].bins + lVar6 + -8);
      tcache_00 = (tcache_t *)((long)tcache->bins + lVar6 + -8);
      *(uint *)((long)&tcache[1].bins[1].low_bits_low_water + lVar6) =
           duckdb_je_global_do_not_change_tcache_nbins;
      tcache_init(tsd_00,(tcache_slow_t *)tcache_00,tcache,opt_tcache_ncached_max,
                  (cache_bin_info_t *)prVar12);
      if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level < '\x01') {
        aVar10.repr = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_iarena;
        if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_iarena == (arena_t *)0x0) &&
           (aVar10.repr = duckdb_je_arena_choose_hard(tsd,true),
           tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == true)) {
          paVar5 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow).arena;
          if (paVar5 == (arena_t *)0x0) {
            duckdb_je_tcache_arena_associate
                      ((tsdn_t *)tsd,
                       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow,
                       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,
                       (arena_t *)aVar10.repr);
          }
          else if (paVar5 != (arena_t *)aVar10.repr) {
            duckdb_je_tcache_arena_reassociate
                      ((tsdn_t *)tsd,
                       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow,
                       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,
                       (arena_t *)aVar10.repr);
          }
        }
      }
      else {
        aVar10 = duckdb_je_arenas[0];
        if (duckdb_je_arenas[0].repr == (void *)0x0) {
          aVar10.repr = duckdb_je_arena_init((tsdn_t *)tsd,0,&duckdb_je_arena_config_default);
        }
      }
      duckdb_je_tcache_arena_associate
                ((tsdn_t *)tsd,(tcache_slow_t *)tsd_00,tcache_00,(arena_t *)aVar10.repr);
      return tcache_00;
    }
  }
  return (tcache_t *)0x0;
}

Assistant:

tcache_t *
tcache_create_explicit(tsd_t *tsd) {
	/*
	 * We place the cache bin stacks, then the tcache_t, then a pointer to
	 * the beginning of the whole allocation (for freeing).  The makes sure
	 * the cache bins have the requested alignment.
	 */
	unsigned tcache_nbins = global_do_not_change_tcache_nbins;
	size_t tcache_size, alignment;
	cache_bin_info_compute_alloc(tcache_get_default_ncached_max(),
	    tcache_nbins, &tcache_size, &alignment);

	size_t size = tcache_size + sizeof(tcache_t)
	    + sizeof(tcache_slow_t);
	/* Naturally align the pointer stacks. */
	size = PTR_CEILING(size);
	size = sz_sa2u(size, alignment);

	void *mem = ipallocztm(tsd_tsdn(tsd), size, alignment,
	    true, NULL, true, arena_get(TSDN_NULL, 0, true));
	if (mem == NULL) {
		return NULL;
	}
	tcache_t *tcache = (void *)((byte_t *)mem + tcache_size);
	tcache_slow_t *tcache_slow =
	    (void *)((byte_t *)mem + tcache_size + sizeof(tcache_t));
	tcache_default_settings_init(tcache_slow);
	tcache_init(tsd, tcache_slow, tcache, mem,
	    tcache_get_default_ncached_max());

	tcache_arena_associate(tsd_tsdn(tsd), tcache_slow, tcache,
	    arena_ichoose(tsd, NULL));

	return tcache;
}